

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFDocumentHandler.cpp
# Opt level: O3

EStatusCode __thiscall
PDFDocumentHandler::MergePDFPagesToPageInContext
          (PDFDocumentHandler *this,PDFPage *inPage,PDFPageRange *inPageRange,
          ObjectIDTypeList *inCopyAdditionalObjects)

{
  _Rb_tree_header *p_Var1;
  EStatusCode EVar2;
  _Rb_tree_node_base *p_Var3;
  Trace *pTVar4;
  _List_node_base *p_Var5;
  _Base_ptr p_Var6;
  unsigned_long uVar7;
  _List_node_base *p_Var8;
  _List_node_base *p_Var9;
  ulong uVar10;
  bool bVar11;
  
  p_Var1 = &(this->mExtenders)._M_t._M_impl.super__Rb_tree_header;
  for (p_Var3 = (this->mExtenders)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      EVar2 = eSuccess, (_Rb_tree_header *)p_Var3 != p_Var1;
      p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
    EVar2 = (**(code **)(**(long **)(p_Var3 + 1) + 0x48))
                      (*(long **)(p_Var3 + 1),this->mObjectsContext,this->mDocumentContext,this);
    if (EVar2 != eSuccess) {
      pTVar4 = Trace::DefaultTrace();
      Trace::TraceToLog(pTVar4,
                        "DocumentContext::MergePDFPagesToPage, unexpected failure. extender declared failure after parsing page."
                       );
      break;
    }
  }
  if ((inCopyAdditionalObjects->super__List_base<unsigned_long,_std::allocator<unsigned_long>_>).
      _M_impl._M_node._M_size != 0) {
    EVar2 = WriteNewObjects(this,inCopyAdditionalObjects);
    if (EVar2 != eSuccess) {
      pTVar4 = Trace::DefaultTrace();
      Trace::TraceToLog(pTVar4,
                        "PDFDocumentHandler::MergePDFPagesToPage, failed copying additional objects"
                       );
      goto LAB_001c84cb;
    }
    EVar2 = eSuccess;
  }
  if (inPageRange->mType == eRangeTypeAll) {
    uVar7 = PDFParser::GetPagesCount(this->mParser);
    if ((EVar2 == eSuccess) && (uVar7 != 0)) {
      uVar10 = 1;
      do {
        EVar2 = MergePDFPageForPage(this,inPage,uVar10 - 1);
        if (EVar2 != eSuccess) {
          pTVar4 = Trace::DefaultTrace();
          Trace::TraceToLog(pTVar4,
                            "PDFDocumentHandler::MergePDFPagesToPage, failed to embed page %ld",
                            uVar10 - 1);
        }
        uVar7 = PDFParser::GetPagesCount(this->mParser);
      } while ((EVar2 == eSuccess) && (bVar11 = uVar10 < uVar7, uVar10 = uVar10 + 1, bVar11));
    }
  }
  else {
    p_Var9 = (inPageRange->mSpecificRanges).
             super__List_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
             ._M_impl._M_node.super__List_node_base._M_next;
    if (EVar2 == eSuccess && p_Var9 != (_List_node_base *)&inPageRange->mSpecificRanges) {
      do {
        p_Var8 = p_Var9[1]._M_prev;
        if ((p_Var8 < p_Var9[1]._M_next) ||
           (p_Var5 = (_List_node_base *)PDFParser::GetPagesCount(this->mParser), p_Var5 <= p_Var8))
        {
          pTVar4 = Trace::DefaultTrace();
          p_Var8 = p_Var9[1]._M_next;
          p_Var9 = p_Var9[1]._M_prev;
          uVar7 = PDFParser::GetPagesCount(this->mParser);
          Trace::TraceToLog(pTVar4,
                            "PDFDocumentHandler::MergePDFPagesToPage, range mismatch. first = %ld, second = %ld, PDF page count = %ld"
                            ,p_Var8,p_Var9,uVar7);
          EVar2 = eFailure;
          goto LAB_001c84cb;
        }
        for (p_Var8 = p_Var9[1]._M_next; p_Var8 <= p_Var9[1]._M_prev;
            p_Var8 = (_List_node_base *)((long)&p_Var8->_M_next + 1)) {
          EVar2 = MergePDFPageForPage(this,inPage,(unsigned_long)p_Var8);
          if (EVar2 != eSuccess) {
            pTVar4 = Trace::DefaultTrace();
            Trace::TraceToLog(pTVar4,
                              "PDFDocumentHandler::MergePDFPagesToPage, failed to embed page %ld",
                              p_Var8);
            goto LAB_001c84cb;
          }
          if (EVar2 != eSuccess) break;
        }
        p_Var9 = p_Var9->_M_next;
      } while (p_Var9 != (_List_node_base *)&inPageRange->mSpecificRanges);
      EVar2 = eSuccess;
    }
  }
  p_Var6 = (this->mExtenders)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if (((_Rb_tree_header *)p_Var6 != p_Var1) && (EVar2 == eSuccess)) {
    do {
      EVar2 = (**(code **)(**(long **)(p_Var6 + 1) + 0x80))
                        (*(long **)(p_Var6 + 1),this->mObjectsContext,this->mDocumentContext,this);
      if (EVar2 != eSuccess) {
        pTVar4 = Trace::DefaultTrace();
        Trace::TraceToLog(pTVar4,
                          "DocumentContext::MergePDFPagesToPage, unexpected failure. extender declared failure before finalizing copy."
                         );
        break;
      }
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
      EVar2 = eSuccess;
    } while ((_Rb_tree_header *)p_Var6 != p_Var1);
  }
LAB_001c84cb:
  StopCopyingContext(this);
  return EVar2;
}

Assistant:

EStatusCode PDFDocumentHandler::MergePDFPagesToPageInContext(PDFPage* inPage,
															const PDFPageRange& inPageRange,
															const ObjectIDTypeList& inCopyAdditionalObjects)
{
	EStatusCode status = PDFHummus::eSuccess;

	do
	{
		IDocumentContextExtenderSet::iterator it = mExtenders.begin();
		for(; it != mExtenders.end() && PDFHummus::eSuccess == status; ++it)
		{
			status = (*it)->OnPDFParsingComplete(mObjectsContext,mDocumentContext,this);
			if(status != PDFHummus::eSuccess)
				TRACE_LOG("DocumentContext::MergePDFPagesToPage, unexpected failure. extender declared failure after parsing page.");
		}

	// copy additional objects prior to pages, so we have them ready at page merging
		if(inCopyAdditionalObjects.size() > 0)
		{
			status = WriteNewObjects(inCopyAdditionalObjects);
			if(status != PDFHummus::eSuccess)
			{
				TRACE_LOG("PDFDocumentHandler::MergePDFPagesToPage, failed copying additional objects");
				break;
			}
		}

		if(PDFPageRange::eRangeTypeAll == inPageRange.mType)
		{
			for(unsigned long i=0; i < mParser->GetPagesCount() && PDFHummus::eSuccess == status; ++i)
			{
				status = MergePDFPageForPage(inPage,i);
				if(status != PDFHummus::eSuccess)
					TRACE_LOG1("PDFDocumentHandler::MergePDFPagesToPage, failed to embed page %ld", i);
			}
		}
		else
		{
			// eRangeTypeSpecific
			ULongAndULongList::const_iterator it = inPageRange.mSpecificRanges.begin();
			for(; it != inPageRange.mSpecificRanges.end() && PDFHummus::eSuccess == status;++it)
			{
				if(it->first <= it->second && it->second < mParser->GetPagesCount())
				{
					for(unsigned long i=it->first; i <= it->second && PDFHummus::eSuccess == status; ++i)
					{
						status = MergePDFPageForPage(inPage,i);
						if(status != PDFHummus::eSuccess)
							TRACE_LOG1("PDFDocumentHandler::MergePDFPagesToPage, failed to embed page %ld", i);
					}
				}
				else
				{
					TRACE_LOG3("PDFDocumentHandler::MergePDFPagesToPage, range mismatch. first = %ld, second = %ld, PDF page count = %ld", 
						it->first,
						it->second,
						mParser->GetPagesCount());
					status = PDFHummus::eFailure;
				}
			}
		}


	}while(false);

	IDocumentContextExtenderSet::iterator it = mExtenders.begin();
	for(; it != mExtenders.end() && PDFHummus::eSuccess == status; ++it)
	{
		status = (*it)->OnPDFCopyingComplete(mObjectsContext,mDocumentContext,this);
		if(status != PDFHummus::eSuccess)
			TRACE_LOG("DocumentContext::MergePDFPagesToPage, unexpected failure. extender declared failure before finalizing copy.");
	}

	StopCopyingContext();

	return status;

}